

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

bool lest::search(text *part,text *line)

{
  bool bVar1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __predicate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe8;
  
  this = in_RSI;
  __last1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      (in_RSI);
  __first2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                       (this);
  __last2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      (in_RSI);
  __predicate = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                          (this);
  std::
  search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,bool(*)(char,char)>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last1._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first2._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last2._M_current,(_func_bool_char_char *)__predicate._M_current);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end(this);
  bVar1 = __gnu_cxx::
          operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    (in_RDI,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_RSI);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

inline bool search( text part, text line )
    {
        return std::search(
            line.begin(), line.end(),
            part.begin(), part.end(), case_insensitive_equal ) != line.end();
    }